

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * pbrt::ReadFloatFile(string *filename)

{
  string_view str;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__filename;
  FILE *__stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  float v;
  unsigned_long vb;
  int va;
  vector<float,_std::allocator<float>_> values;
  int lineNumber;
  int curNumberPos;
  char curNumber [32];
  bool inNumber;
  int c;
  FILE *f;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff18;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff20;
  value_type_conflict *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char (*in_stack_ffffffffffffff68) [18];
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  float *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  LogLevel in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  LogLevel in_stack_ffffffffffffff94;
  char (*in_stack_ffffffffffffffa0) [13];
  int *in_stack_ffffffffffffffa8;
  int iVar5;
  uint uVar6;
  unsigned_long *in_stack_ffffffffffffffb8;
  
  args = in_RDI;
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    Error<std::__cxx11::string_const&>
              ((char *)in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x545b82);
  }
  else {
    bVar1 = false;
    uVar6 = 0;
    iVar5 = 1;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x545bb2);
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar2 = getc(__stream);
            if (iVar2 == -1) {
              fclose(__stream);
              std::vector<float,_std::allocator<float>_>::vector
                        (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              goto LAB_00545f2c;
            }
            if (iVar2 == 10) {
              iVar5 = iVar5 + 1;
            }
            if (!bVar1) break;
            if (0x1f < (int)uVar6) {
              LogFatal<std::__cxx11::string_const&,int&>
                        (in_stack_ffffffffffffff84,(char *)in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff74,*in_stack_ffffffffffffff68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),(int *)args);
            }
            iVar3 = isdigit(iVar2);
            if ((((iVar3 == 0) && (iVar2 != 0x2e)) &&
                ((iVar2 != 0x65 && ((iVar2 != 0x45 && (iVar2 != 0x2d)))))) && (iVar2 != 0x2b)) {
              (&stack0xffffffffffffffb8)[(int)uVar6] = 0;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
              str._M_len._4_4_ = in_stack_ffffffffffffff84;
              str._M_len._0_4_ = in_stack_ffffffffffffff80;
              str._M_str._0_4_ = in_stack_ffffffffffffff88;
              str._M_str._4_4_ = in_stack_ffffffffffffff8c;
              bVar1 = Atof(str,in_stack_ffffffffffffff78);
              in_stack_ffffffffffffff48 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff48);
              if (!bVar1) {
                ErrorExit<std::__cxx11::string_const&,char(&)[32]>
                          ((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           args,(char (*) [32])in_RDI);
              }
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28);
              bVar1 = false;
              uVar6 = 0;
            }
            else {
              in_stack_ffffffffffffff80 = 0x20;
              in_stack_ffffffffffffff84 = Verbose;
              if (0x1f < uVar6) {
                LogFatal<char_const(&)[13],char_const(&)[18],char_const(&)[13],int&,char_const(&)[18],unsigned_long&>
                          (in_stack_ffffffffffffff94,
                           (char *)CONCAT44(in_stack_ffffffffffffff8c,uVar6),0,
                           (char *)in_stack_ffffffffffffff78,
                           (char (*) [13])
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff68,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffffa8,(char (*) [18])CONCAT44(uVar6,iVar5),
                           in_stack_ffffffffffffffb8);
              }
              (&stack0xffffffffffffffb8)[(int)uVar6] = (char)iVar2;
              in_stack_ffffffffffffff88 = uVar6;
              uVar6 = uVar6 + 1;
            }
          }
          iVar3 = iVar2;
          iVar4 = isdigit(iVar2);
          if ((((iVar4 == 0) && (iVar2 != 0x2e)) && (iVar2 != 0x2d)) && (iVar2 != 0x2b)) break;
          bVar1 = true;
          (&stack0xffffffffffffffb8)[(int)uVar6] = (char)iVar2;
          uVar6 = uVar6 + 1;
        }
        if (iVar2 != 0x23) break;
        do {
          iVar2 = getc(__stream);
        } while (iVar2 != 10 && iVar2 != -1);
        iVar5 = iVar5 + 1;
      }
      iVar2 = isspace(iVar2);
    } while (iVar2 != 0);
    Error<std::__cxx11::string_const&,int&,int&>
              ((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),args,
               (int *)in_RDI,(int *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x545eee);
LAB_00545f2c:
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff30);
  }
  return (vector<float,_std::allocator<float>_> *)args;
}

Assistant:

std::vector<float> ReadFloatFile(const std::string &filename) {
    FILE *f = fopen(filename.c_str(), "r");
    if (f == nullptr) {
        Error("%s: unable to open file", filename);
        return {};
    }

    int c;
    bool inNumber = false;
    char curNumber[32];
    int curNumberPos = 0;
    int lineNumber = 1;
    std::vector<float> values;
    while ((c = getc(f)) != EOF) {
        if (c == '\n')
            ++lineNumber;
        if (inNumber) {
            if (curNumberPos >= (int)sizeof(curNumber))
                LOG_FATAL("Overflowed buffer for parsing number in file: %s at "
                          "line %d",
                          filename, lineNumber);
            // Note: this is not very robust, and would accept something
            // like 0.0.0.0eeee-+--2 as a valid number.
            if ((isdigit(c) != 0) || c == '.' || c == 'e' || c == 'E' || c == '-' ||
                c == '+') {
                CHECK_LT(curNumberPos, sizeof(curNumber));
                curNumber[curNumberPos++] = c;
            } else {
                curNumber[curNumberPos++] = '\0';
                float v;
                if (!Atof(curNumber, &v))
                    ErrorExit("%s: unable to parse float value \"%s\"", filename,
                              curNumber);
                values.push_back(v);
                inNumber = false;
                curNumberPos = 0;
            }
        } else {
            if ((isdigit(c) != 0) || c == '.' || c == '-' || c == '+') {
                inNumber = true;
                curNumber[curNumberPos++] = c;
            } else if (c == '#') {
                while ((c = getc(f)) != '\n' && c != EOF)
                    ;
                ++lineNumber;
            } else if (isspace(c) == 0) {
                Error("%s: unexpected character \"%c\" found at line %d.", filename, c,
                      lineNumber);
                return {};
            }
        }
    }
    fclose(f);
    return values;
}